

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDM.h
# Opt level: O0

int PurgeDataMDM(MDM *pMDM)

{
  int iVar1;
  char *pcVar2;
  MDM *pMDM_local;
  
  iVar1 = PurgeRS232Port(&pMDM->RS232Port);
  if (iVar1 != 0) {
    pcVar2 = strtime_m();
    printf("PurgeDataMDM error (%s) : %s(pMDM=%#x)\n",pcVar2,"Error purging data from a MDM. ",
           (ulong)pMDM & 0xffffffff);
  }
  pMDM_local._4_4_ = (uint)(iVar1 != 0);
  return pMDM_local._4_4_;
}

Assistant:

inline int PurgeDataMDM(MDM* pMDM)
{
	if (PurgeRS232Port(&pMDM->RS232Port) != EXIT_SUCCESS)
	{
		printf("PurgeDataMDM error (%s) : %s"
			"(pMDM=%#x)\n", 
			strtime_m(), 
			"Error purging data from a MDM. ", 
			(unsigned int)(intptr_t)pMDM);
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}